

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O2

void HTS_PStream_calc_gv(HTS_PStream *pst,size_t m,double *mean,double *vari)

{
  size_t sVar1;
  size_t sVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  *mean = 0.0;
  sVar1 = pst->length;
  dVar4 = 0.0;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    if (pst->gv_switch[sVar2] != '\0') {
      dVar4 = dVar4 + pst->par[sVar2][m];
      *mean = dVar4;
    }
  }
  dVar3 = ((double)CONCAT44(0x45300000,(int)(pst->gv_length >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)pst->gv_length) - 4503599627370496.0);
  *mean = dVar4 / dVar3;
  *vari = 0.0;
  dVar4 = 0.0;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    if (pst->gv_switch[sVar2] != '\0') {
      dVar5 = pst->par[sVar2][m] - *mean;
      dVar4 = dVar4 + dVar5 * dVar5;
      *vari = dVar4;
    }
  }
  *vari = dVar4 / dVar3;
  return;
}

Assistant:

static void HTS_PStream_calc_gv(HTS_PStream * pst, size_t m, double *mean, double *vari)
{
   size_t t;

   *mean = 0.0;
   for (t = 0; t < pst->length; t++)
      if (pst->gv_switch[t])
         *mean += pst->par[t][m];
   *mean /= pst->gv_length;
   *vari = 0.0;
   for (t = 0; t < pst->length; t++)
      if (pst->gv_switch[t])
         *vari += (pst->par[t][m] - *mean) * (pst->par[t][m] - *mean);
   *vari /= pst->gv_length;
}